

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption_NamePart::UninterpretedOption_NamePart
          (UninterpretedOption_NamePart *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_NamePart_004256f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (UninterpretedOption_NamePart *)&_UninterpretedOption_NamePart_default_instance_) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  (this->name_part_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->is_extension_ = false;
  return;
}

Assistant:

UninterpretedOption_NamePart::UninterpretedOption_NamePart()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.UninterpretedOption.NamePart)
}